

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Clara::CommandLine<Catch::ConfigData>::Arg::Arg(Arg *this,Arg *param_2)

{
  long in_RSI;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  BoundArgFunction<Catch::ConfigData> *in_stack_ffffffffffffffb8;
  BoundArgFunction<Catch::ConfigData> *in_stack_ffffffffffffffc0;
  
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::string((string *)(in_RDI + 0x20),(string *)(in_RSI + 0x20));
  std::__cxx11::string::string((string *)(in_RDI + 0x40),(string *)(in_RSI + 0x40));
  std::__cxx11::string::string((string *)(in_RDI + 0x60),(string *)(in_RSI + 0x60));
  *(undefined4 *)(in_RDI + 0x80) = *(undefined4 *)(in_RSI + 0x80);
  return;
}

Assistant:

Arg( Detail::BoundArgFunction<ConfigT> const& _boundField ) : boundField( _boundField ), position( -1 ) {}